

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall REPL::REPL(REPL *this)

{
  int iVar1;
  vector<int,_std::allocator<int>_> local_38;
  
  (this->board).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->board).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->board).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ai).board = &this->board;
  (this->ai).boardSize =
       ((long)(this->board).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish >> 3) * -0x5555555555555555;
  iVar1 = 0xf;
  do {
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(0x3c);
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 0xf;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0xb] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0xc] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0xd] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0xe] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [8] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [9] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [10] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0xb] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [4] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [5] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [6] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [7] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [0] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [3] = 0;
    local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    std::
    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
    ::emplace_back<std::vector<int,std::allocator<int>>>
              ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)this,&local_38);
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

REPL::REPL() : ai(board) {
    for (int i = 0; i < BOARD_SIZE; i++) {
        board.emplace_back(move(vector<int>(BOARD_SIZE, 0)));
    }
}